

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

void disable_interrupt(ixgbe_device *dev,uint16_t queue_id)

{
  uint32_t uVar1;
  uint value;
  undefined2 in_SI;
  long in_RDI;
  u32 mask;
  uint16_t in_stack_ffffffffffffffee;
  undefined2 in_stack_fffffffffffffff4;
  
  uVar1 = get_reg32(*(uint8_t **)(in_RDI + 0x70),0x880);
  value = (1 << ((byte)in_SI & 0x1f) ^ 0xffffffffU) & uVar1;
  set_reg32(*(uint8_t **)(in_RDI + 0x70),0x880,value);
  clear_interrupt((ixgbe_device *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,value)),
                  in_stack_ffffffffffffffee);
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Using polling\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",0x74
          ,"disable_interrupt");
  return;
}

Assistant:

static void disable_interrupt(struct ixgbe_device* dev, uint16_t queue_id) {
	// Clear interrupt mask to stop from interrupts being generated
	u32 mask = get_reg32(dev->addr, IXGBE_EIMS);
	mask &= ~(1 << queue_id);
	set_reg32(dev->addr, IXGBE_EIMS, mask);
	clear_interrupt(dev, queue_id);
	debug("Using polling");
}